

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LockFreeQueue.h
# Opt level: O2

void __thiscall
NotLockFreeQueue<std::packaged_task<void_()>_>::pop_and_wait
          (NotLockFreeQueue<std::packaged_task<void_()>_> *this,packaged_task<void_()> *item)

{
  packaged_task<void_()> *__other;
  unique_lock<std::mutex> m;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->mutex);
  __other = (this->queue).c.
            super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->queue).c.
      super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur == __other) {
    std::condition_variable::
    wait<NotLockFreeQueue<std::packaged_task<void()>>::pop_and_wait(std::packaged_task<void()>&)::_lambda()_1_>
              (&this->cond_var_pop,&local_20,(anon_class_8_1_8991fb9c)this);
    __other = (this->queue).c.
              super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
  }
  std::packaged_task<void_()>::operator=(item,__other);
  std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>::pop_front
            ((deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_> *)
             this);
  std::unique_lock<std::mutex>::unlock(&local_20);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void NotLockFreeQueue<T>::pop_and_wait(T& item) {
    std::unique_lock<std::mutex> m(mutex);
    if (queue.empty()) {
        cond_var_pop.wait(m, [this]{return !queue.empty();});
    }
    item = std::move(queue.front());
    queue.pop();
    m.unlock();
    cond_var_push.notify_one();
}